

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_demangle.h
# Opt level: O0

string * __thiscall cute::demangle_abi_cxx11_(string *__return_storage_ptr__,cute *this,char *name)

{
  allocator<char> local_19;
  cute *local_18;
  char *name_local;
  string *result;
  
  local_18 = this;
  name_local = (char *)__return_storage_ptr__;
  if (this == (cute *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    cute_impl_demangle::plain_demangle_abi_cxx11_
              (__return_storage_ptr__,(cute_impl_demangle *)this,name);
    cute_impl_demangle::patchresultforstring(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string demangle(char const *name){
	if (!name) return "unknown";
	std::string result(cute_impl_demangle::plain_demangle(name));
#if defined(_LIBCPP_NAMESPACE) || defined(_GLIBCXX_USE_CXX11_ABI)
	cute_impl_demangle::patchresultforstring(result);
#endif
	return result;
}